

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
          (PersistentStorageJson *this)

{
  pointer pcVar1;
  
  (this->super_PersistentStorage)._vptr_PersistentStorage =
       (_func_int **)&PTR__PersistentStorageJson_002b8780;
  CacheToFile(this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::clear(&this->mCache);
  ot::os::semaphore::SemaphoreClose(&this->mStorageLock);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&this->mCache);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&(this->mCache).m_value.boolean,(this->mCache).m_type);
  pcVar1 = (this->mFileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mFileName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

PersistentStorageJson::~PersistentStorageJson()
{
    Close();
    mCache.clear();
    SemaphoreClose(mStorageLock);
}